

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

int __thiscall Epanet::Project::openReport(Project *this,char *fname)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  FileError *pFVar5;
  ENerror *e;
  ReportWriter rw;
  string local_50 [8];
  string s;
  char *fname_local;
  Project *this_local;
  
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    closeReport(this);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,fname,(allocator *)((long)&rw.network + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&rw.network + 7));
  lVar3 = std::__cxx11::string::size();
  lVar4 = std::__cxx11::string::size();
  if ((lVar3 == lVar4) && (bVar2 = Utilities::match((string *)local_50,&this->inpFileName), bVar2))
  {
    pFVar5 = (FileError *)__cxa_allocate_exception(0x30);
    FileError::FileError(pFVar5,0);
    __cxa_throw(pFVar5,&FileError::typeinfo,FileError::~FileError);
  }
  lVar3 = std::__cxx11::string::size();
  lVar4 = std::__cxx11::string::size();
  if ((lVar3 == lVar4) && (bVar2 = Utilities::match((string *)local_50,&this->outFileName), bVar2))
  {
    pFVar5 = (FileError *)__cxa_allocate_exception(0x30);
    FileError::FileError(pFVar5,0);
    __cxa_throw(pFVar5,&FileError::typeinfo,FileError::~FileError);
  }
  std::ofstream::open((char *)&this->rptFile,(_Ios_Openmode)fname);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    ReportWriter::ReportWriter((ReportWriter *)&e,&this->rptFile,&this->network);
    ReportWriter::writeHeading((ReportWriter *)&e);
    ReportWriter::~ReportWriter((ReportWriter *)&e);
    std::__cxx11::string::~string(local_50);
    return 0;
  }
  pFVar5 = (FileError *)__cxa_allocate_exception(0x30);
  FileError::FileError(pFVar5,2);
  __cxa_throw(pFVar5,&FileError::typeinfo,FileError::~FileError);
}

Assistant:

int  Project::openReport(const char* fname)
    {
        try
        {
            //... close an already opened report file
            if ( rptFile.is_open() ) closeReport();

           // ... check that file name is different from input file name
            string s = fname;
            if ( s.size() == inpFileName.size() && Utilities::match(s, inpFileName) )
            {
                throw FileError(FileError::DUPLICATE_FILE_NAMES);
            }
            if ( s.size() == outFileName.size() && Utilities::match(s, outFileName) )
            {
                throw FileError(FileError::DUPLICATE_FILE_NAMES);
            }

            // ... open the report file
            rptFile.open(fname);
            if ( !rptFile.is_open() )
            {
                throw FileError(FileError::CANNOT_OPEN_REPORT_FILE);
            }
            ReportWriter rw(rptFile, &network);
            rw.writeHeading();
            return 0;
        }
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }